

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O1

bool __thiscall QAsn1Element::toBool(QAsn1Element *this,bool *ok)

{
  size_t sVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  QAsn1Element local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  fromBool(&local_50,true);
  if ((this->mType == local_50.mType) &&
     (sVar1 = (this->mValue).d.size, sVar1 == local_50.mValue.d.size)) {
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((this->mValue).d.ptr,local_50.mValue.d.ptr,sVar1);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (&(local_50.mValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_50.mValue.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (bVar3 == false) {
    bVar4 = false;
    fromBool(&local_50,false);
    if (this->mType == local_50.mType) {
      sVar1 = (this->mValue).d.size;
      if (sVar1 == local_50.mValue.d.size) {
        if (sVar1 == 0) {
          bVar4 = true;
        }
        else {
          iVar2 = bcmp((this->mValue).d.ptr,local_50.mValue.d.ptr,sVar1);
          bVar4 = iVar2 == 0;
        }
      }
      else {
        bVar4 = false;
      }
    }
    if (&(local_50.mValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_50.mValue.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    bVar4 = true;
  }
  if (ok != (bool *)0x0) {
    *ok = bVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QAsn1Element::toBool(bool *ok) const
{
    if (*this == fromBool(true)) {
        if (ok)
            *ok = true;
        return true;
    } else if (*this == fromBool(false)) {
        if (ok)
            *ok = true;
        return false;
    } else {
        if (ok)
            *ok = false;
        return false;
    }
}